

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O0

Var mapVar(Var x,vec<int> *map,Var *max)

{
  int iVar1;
  int *piVar2;
  int local_24;
  int *local_20;
  Var *max_local;
  vec<int> *map_local;
  Var x_local;
  
  local_20 = max;
  max_local = (Var *)map;
  map_local._4_4_ = x;
  iVar1 = Gluco::vec<int>::size(map);
  if (map_local._4_4_ < iVar1) {
    piVar2 = Gluco::vec<int>::operator[]((vec<int> *)max_local,map_local._4_4_);
    if (*piVar2 != -1) goto LAB_0072a32b;
  }
  local_24 = -1;
  Gluco::vec<int>::growTo((vec<int> *)max_local,map_local._4_4_ + 1,&local_24);
  iVar1 = *local_20;
  *local_20 = iVar1 + 1;
  piVar2 = Gluco::vec<int>::operator[]((vec<int> *)max_local,map_local._4_4_);
  *piVar2 = iVar1;
LAB_0072a32b:
  piVar2 = Gluco::vec<int>::operator[]((vec<int> *)max_local,map_local._4_4_);
  return *piVar2;
}

Assistant:

static Var mapVar(Var x, vec<Var>& map, Var& max)
{
    if (map.size() <= x || map[x] == -1){
        map.growTo(x+1, -1);
        map[x] = max++;
    }
    return map[x];
}